

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericconstant.cpp
# Opt level: O0

char NumericConstantChars::getChar(NumericConstantChar numChar)

{
  code *pcVar1;
  char local_9;
  NumericConstantChar numChar_local;
  
  switch(numChar) {
  case Zero:
    local_9 = '0';
    break;
  case One:
    local_9 = '1';
    break;
  case Two:
    local_9 = '2';
    break;
  case Three:
    local_9 = '3';
    break;
  case Four:
    local_9 = '4';
    break;
  case Five:
    local_9 = '5';
    break;
  case Six:
    local_9 = '6';
    break;
  case Seven:
    local_9 = '7';
    break;
  case Eight:
    local_9 = '8';
    break;
  case Nine:
    local_9 = '9';
    break;
  case A:
    local_9 = 'a';
    break;
  case B:
    local_9 = 'b';
    break;
  case C:
    local_9 = 'c';
    break;
  case D:
    local_9 = 'd';
    break;
  case E:
    local_9 = 'e';
    break;
  case F:
    local_9 = 'f';
    break;
  case MinusSign:
    local_9 = '-';
    break;
  case PlusSign:
    local_9 = '+';
    break;
  case DecimalPoint:
    local_9 = '.';
    break;
  case ImaginaryUnit:
    local_9 = 'i';
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_9;
}

Assistant:

char NumericConstantChars::getChar(NumericConstantChar numChar) {
	switch (numChar) {
		case NumericConstantChar::Zero:
			return '0';
		case NumericConstantChar::One:
			return '1';
		case NumericConstantChar::Two:
			return '2';
		case NumericConstantChar::Three:
			return '3';
		case NumericConstantChar::Four:
			return '4';
		case NumericConstantChar::Five:
			return '5';
		case NumericConstantChar::Six:
			return '6';
		case NumericConstantChar::Seven:
			return '7';
		case NumericConstantChar::Eight:
			return '8';
		case NumericConstantChar::Nine:
			return '9';
		case NumericConstantChar::A:
			return 'a';
		case NumericConstantChar::B:
			return 'b';
		case NumericConstantChar::C:
			return 'c';
		case NumericConstantChar::D:
			return 'd';
		case NumericConstantChar::E:
			return 'e';
		case NumericConstantChar::F:
			return 'f';
		case NumericConstantChar::MinusSign:
			return '-';
		case NumericConstantChar::PlusSign:
			return '+';
		case NumericConstantChar::DecimalPoint:
			return '.';
		case NumericConstantChar::ImaginaryUnit:
			return 'i';
	}
}